

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::Branch::fire(Branch *this)

{
  PromiseArenaMember *node;
  Event *in_RDX;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *extraout_RDX_01;
  long lVar1;
  long in_RSI;
  long lVar2;
  int iVar3;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar4;
  
  lVar1 = *(long *)(in_RSI + 0x40);
  if (*(char *)(lVar1 + 0x28) == '\0') {
    iVar3 = *(int *)(lVar1 + 0x18) + -1;
    *(int *)(lVar1 + 0x18) = iVar3;
    (**(code **)(**(long **)(in_RSI + 0x48) + 0x18))
              (*(long **)(in_RSI + 0x48),*(undefined8 *)(lVar1 + 0x10));
    lVar1 = *(long *)(in_RSI + 0x40);
    in_RDX = extraout_RDX;
    if ((**(char **)(lVar1 + 0x10) == '\0') && (*(long *)(lVar1 + 0x38) != 0)) {
      lVar2 = *(long *)(lVar1 + 0x30);
      lVar1 = *(long *)(lVar1 + 0x38) * 0x50;
      do {
        if ((lVar2 != in_RSI) &&
           (node = *(PromiseArenaMember **)(lVar2 + 0x48), node != (PromiseArenaMember *)0x0)) {
          *(undefined8 *)(lVar2 + 0x48) = 0;
          PromiseDisposer::dispose(node);
          in_RDX = extraout_RDX_00;
        }
        lVar2 = lVar2 + 0x50;
        lVar1 = lVar1 + -0x50;
      } while (lVar1 != 0);
    }
    lVar1 = *(long *)(in_RSI + 0x40);
    if ((**(char **)(lVar1 + 0x10) != '\x01') || (iVar3 == 0)) {
      *(undefined1 *)(lVar1 + 0x28) = 1;
      PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(lVar1 + 0x20));
      in_RDX = extraout_RDX_01;
    }
  }
  (this->super_Event)._vptr_Event = (_func_int **)0x0;
  (this->super_Event).loop = (EventLoop *)0x0;
  MVar4.ptr.ptr = in_RDX;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<Event>> RaceSuccessfulPromiseNodeBase::Branch::fire() {
  if (parent.armed) {
    // the parent node has already received the value, no need to bother with
    // anything
    return kj::none;
  }

  auto count = --parent.countLeft;
  promise->get(parent.output);

  if (parent.output.exception == kj::none) {
    // our promise was successful

    // cancel the others, ignore errors caused by cancellations
    for (auto& otherBranch: parent.branches) {
      if (this != &otherBranch) {
        kj::runCatchingExceptions([&]() { otherBranch.promise = nullptr; });
      }
    }
  }

  if (parent.output.exception == kj::none || count == 0) {
    // we're either successful or the only one left, trigger the parent
    parent.armed = true;
    parent.onReadyEvent.arm();
  }

  return kj::none;
}